

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::ToYa::writeTile(ToYa *this,int dx,int dy,int lx,int ly)

{
  ostream *poVar1;
  char *pcVar2;
  ArgExc *this_00;
  Rgba *pRVar3;
  TiledOutputFile *this_01;
  long in_RDI;
  FrameBuffer fb;
  Rgba *ptr;
  int x1;
  int x;
  int y1;
  int y;
  intptr_t base;
  int width;
  Box2i dw;
  stringstream _iex_throw_s;
  FrameBuffer *in_stack_00000258;
  TiledOutputFile *in_stack_00000260;
  int iVar4;
  int in_stack_fffffffffffffd14;
  int dy_00;
  int in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd4b;
  int in_stack_fffffffffffffd4c;
  V3f *in_stack_fffffffffffffd50;
  Slice local_280;
  Slice local_248;
  V3f *local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long local_1c8;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [152];
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  TiledOutputFile *in_stack_ffffffffffffff18;
  Slice *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  FrameBuffer *in_stack_ffffffffffffffc0;
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,
                             "No frame buffer was specified as the pixel data source for image file \""
                            );
    pcVar2 = TiledOutputFile::fileName((TiledOutputFile *)0x24ac61);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  TiledOutputFile::dataWindowForTile
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  local_1c0 = (local_1b4 - local_1bc) + 1;
  local_1c8 = *(long *)(in_RDI + 0x60);
  local_1d0 = 0;
  for (local_1cc = local_1b8; local_1cc <= local_1b0; local_1cc = local_1cc + 1) {
    local_1d8 = 0;
    for (local_1d4 = local_1bc; local_1d4 <= local_1b4; local_1d4 = local_1d4 + 1) {
      in_stack_fffffffffffffd50 =
           (V3f *)(local_1c8 +
                  ((long)local_1d4 * *(long *)(in_RDI + 0x68) +
                  (long)local_1cc * *(long *)(in_RDI + 0x70)) * 8);
      local_1e0 = in_stack_fffffffffffffd50;
      pRVar3 = Array2D<Imf_3_4::Rgba>::operator[]
                         ((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48),(long)local_1d0);
      pRVar3[local_1d8] = *(Rgba *)in_stack_fffffffffffffd50;
      local_1d8 = local_1d8 + 1;
    }
    in_stack_fffffffffffffd4c =
         CONCAT13(*(undefined1 *)(in_RDI + 0x30),(int3)in_stack_fffffffffffffd4c);
    iVar4 = local_1c0;
    pRVar3 = Array2D<Imf_3_4::Rgba>::operator[]
                       ((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48),(long)local_1d0);
    Array2D<Imf_3_4::Rgba>::operator[]((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48),(long)local_1d0);
    RgbaYca::RGBAtoYCA(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                       (bool)in_stack_fffffffffffffd4b,pRVar3,
                       (Rgba *)CONCAT44(iVar4,in_stack_fffffffffffffd38));
    local_1d0 = local_1d0 + 1;
  }
  FrameBuffer::FrameBuffer((FrameBuffer *)0x24af03);
  pRVar3 = Array2D<Imf_3_4::Rgba>::operator[]
                     ((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48),(long)-local_1b8);
  Slice::Slice(&local_248,HALF,(char *)&pRVar3[-local_1bc].g,8,(ulong)*(uint *)(in_RDI + 0x34) << 3,
               1,1,0.0,false,false);
  FrameBuffer::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  this_01 = (TiledOutputFile *)
            Array2D<Imf_3_4::Rgba>::operator[]
                      ((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x48),(long)-local_1b8);
  dy_00 = 0;
  iVar4 = 0;
  Slice::Slice(&local_280,HALF,
               (char *)((long)&(&this_01->super_GenericOutputFile)[-local_1bc].
                               _vptr_GenericOutputFile + 6),8,(ulong)*(uint *)(in_RDI + 0x34) << 3,1
               ,1,0.0,false,false);
  FrameBuffer::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  TiledOutputFile::setFrameBuffer(in_stack_00000260,in_stack_00000258);
  TiledOutputFile::writeTile
            (this_01,in_stack_fffffffffffffd1c,dy_00,in_stack_fffffffffffffd14,iVar4);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x24b085);
  return;
}

Assistant:

void
TiledRgbaOutputFile::ToYa::writeTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data source for image file "
            "\"" << _outputFile.fileName ()
                 << "\".");
    }

    //
    // Copy the tile's RGBA pixels into _buf and convert
    // them to luminance/alpha format
    //

    Box2i dw    = _outputFile.dataWindowForTile (dx, dy, lx, ly);
    int   width = dw.max.x - dw.min.x + 1;

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
        for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
        {
            Rgba* ptr = reinterpret_cast<Rgba*> (
                base + sizeof (Rgba) * (x * _fbXStride + y * _fbYStride));
            _buf[y1][x1] = *ptr;
        }
        RGBAtoYCA (_yw, width, _writeA, _buf[y1], _buf[y1]);
    }

    //
    // Store the contents of _buf in the output file
    //

    FrameBuffer fb;

    fb.insert (
        "Y",
        Slice (
            HALF,                                  // type
            (char*) &_buf[-dw.min.y][-dw.min.x].g, // base
            sizeof (Rgba),                         // xStride
            sizeof (Rgba) * _tileXSize));          // yStride

    fb.insert (
        "A",
        Slice (
            HALF,                                  // type
            (char*) &_buf[-dw.min.y][-dw.min.x].a, // base
            sizeof (Rgba),                         // xStride
            sizeof (Rgba) * _tileXSize));          // yStride

    _outputFile.setFrameBuffer (fb);
    _outputFile.writeTile (dx, dy, lx, ly);
}